

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaScript.c
# Opt level: O2

Gia_Man_t *
Gia_ManAigSyn2(Gia_Man_t *pInit,int fOldAlgo,int fCoarsen,int fCutMin,int nRelaxRatio,int fDelayMin,
              int fVerbose,int fVeryVerbose)

{
  int iVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  Gia_Man_t *p;
  Gia_Man_t *pGVar5;
  Jf_Par_t Pars;
  
  if (fOldAlgo == 0) {
    Lf_ManSetDefaultPars(&Pars);
    Pars.nAreaTuner = 1;
    Pars.nCutNum = 4;
    Pars.nRelaxRatio = nRelaxRatio;
    Pars.fCoarsen = fCoarsen;
  }
  else {
    Jf_ManSetDefaultPars(&Pars);
  }
  Pars.fCutMin = fCutMin;
  if (fVerbose != 0) {
    Gia_ManPrintStats(pInit,(Gps_Par_t *)0x0);
  }
  p = Gia_ManDup(pInit);
  Gia_ManTransferTiming(p,pInit);
  iVar4 = Gia_ManAndNum(p);
  uVar2 = Pars._84_8_;
  iVar1 = Pars.nRelaxRatio;
  if (iVar4 == 0) {
    pGVar5 = Gia_ManDup(p);
    Gia_ManTransferTiming(pGVar5,p);
  }
  else {
    if ((fDelayMin != 0) && (p->pManTime == (void *)0x0)) {
      Pars.fCoarsen = 0;
      Pars.fCutMin = 0;
      Pars.nRelaxRatio = 0;
      if (fOldAlgo == 0) {
        Lf_ManPerformMapping(p,&Pars);
      }
      else {
        Jf_ManPerformMapping(p,&Pars);
      }
      iVar3 = (int)Pars.Area;
      iVar4 = (int)Pars.Delay;
      pGVar5 = Gia_ManPerformDsdBalance(p,6,4,0,0);
      if (fOldAlgo == 0) {
        Lf_ManPerformMapping(pGVar5,&Pars);
      }
      else {
        Jf_ManPerformMapping(pGVar5,&Pars);
      }
      if (((int)Pars.Delay < iVar4 + -1) ||
         ((iVar4 + 1 == (int)Pars.Delay &&
          (((double)((int)Pars.Area - iVar3) * 100.0) / (double)(int)Pars.Area < 3.0)))) {
        Gia_ManStop(p);
        p = pGVar5;
      }
      else {
        Gia_ManStop(pGVar5);
        Vec_IntFreeP(&p->vMapping);
      }
    }
    Pars.nRelaxRatio = iVar1;
    Pars._84_8_ = uVar2;
    pGVar5 = Gia_ManAreaBalance(p,0,1000000000,fVeryVerbose,0);
    if (fVerbose != 0) {
      Gia_ManPrintStats(pGVar5,(Gps_Par_t *)0x0);
    }
    Gia_ManStop(p);
    if (fOldAlgo == 0) {
      p = Lf_ManPerformMapping(pGVar5,&Pars);
    }
    else {
      p = Jf_ManPerformMapping(pGVar5,&Pars);
    }
    if (fVerbose != 0) {
      Gia_ManPrintStats(p,(Gps_Par_t *)0x0);
    }
    if (pGVar5 != p) {
      Gia_ManStop(pGVar5);
    }
    pGVar5 = Gia_ManAreaBalance(p,0,1000000000,fVeryVerbose,0);
    if (fVerbose != 0) {
      Gia_ManPrintStats(pGVar5,(Gps_Par_t *)0x0);
    }
  }
  Gia_ManStop(p);
  return pGVar5;
}

Assistant:

Gia_Man_t * Gia_ManAigSyn2( Gia_Man_t * pInit, int fOldAlgo, int fCoarsen, int fCutMin, int nRelaxRatio, int fDelayMin, int fVerbose, int fVeryVerbose )
{
    Gia_Man_t * p, * pNew, * pTemp;
    Jf_Par_t Pars, * pPars = &Pars;
    if ( fOldAlgo )
    {
        Jf_ManSetDefaultPars( pPars );
        pPars->fCutMin     = fCutMin;
    }
    else
    {
        Lf_ManSetDefaultPars( pPars );
        pPars->fCutMin     = fCutMin;
        pPars->fCoarsen    = fCoarsen;
        pPars->nRelaxRatio = nRelaxRatio;
        pPars->nAreaTuner  = 1;
        pPars->nCutNum     = 4;
    }
    if ( fVerbose )  Gia_ManPrintStats( pInit, NULL );
    p = Gia_ManDup( pInit );
    Gia_ManTransferTiming( p, pInit );
    if ( Gia_ManAndNum(p) == 0 )
    {
        pNew = Gia_ManDup(p);
        Gia_ManTransferTiming( pNew, p );
        Gia_ManStop( p );
        return pNew;
    }
    // delay optimization
    if ( fDelayMin && p->pManTime == NULL )
    {
        int Area0, Area1, Delay0, Delay1;
        int fCutMin = pPars->fCutMin;
        int fCoarsen = pPars->fCoarsen;
        int nRelaxRatio = pPars->nRelaxRatio;
        pPars->fCutMin = 0;
        pPars->fCoarsen = 0;
        pPars->nRelaxRatio = 0;
        // perform mapping
        if ( fOldAlgo )
            Jf_ManPerformMapping( p, pPars );
        else
            Lf_ManPerformMapping( p, pPars );
        Area0  = (int)pPars->Area;
        Delay0 = (int)pPars->Delay;
        // perform balancing
        pNew = Gia_ManPerformDsdBalance( p, 6, 4, 0, 0 );
        // perform mapping again
        if ( fOldAlgo )
            Jf_ManPerformMapping( pNew, pPars );
        else
            Lf_ManPerformMapping( pNew, pPars );
        Area1  = (int)pPars->Area;
        Delay1 = (int)pPars->Delay;
        // choose the best result
        if ( Delay1 < Delay0 - 1 || (Delay1 == Delay0 + 1 && 100.0 * (Area1 - Area0) / Area1 < 3.0) )
        {
            Gia_ManStop( p );
            p = pNew;
        }
        else
        {
            Gia_ManStop( pNew );
            Vec_IntFreeP( &p->vMapping );
        }
        // reset params
        pPars->fCutMin = fCutMin;
        pPars->fCoarsen = fCoarsen;
        pPars->nRelaxRatio = nRelaxRatio;
    }
    // perform balancing
    pNew = Gia_ManAreaBalance( p, 0, ABC_INFINITY, fVeryVerbose, 0 );
    if ( fVerbose )     Gia_ManPrintStats( pNew, NULL );
    Gia_ManStop( p );
    // perform mapping
    if ( fOldAlgo )
        pNew = Jf_ManPerformMapping( pTemp = pNew, pPars );
    else
        pNew = Lf_ManPerformMapping( pTemp = pNew, pPars );
    if ( fVerbose )     Gia_ManPrintStats( pNew, NULL );
    if ( pTemp != pNew )
        Gia_ManStop( pTemp );
    // perform balancing
    pNew = Gia_ManAreaBalance( pTemp = pNew, 0, ABC_INFINITY, fVeryVerbose, 0 );
    if ( fVerbose )     Gia_ManPrintStats( pNew, NULL );
    Gia_ManStop( pTemp );
    return pNew;
}